

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O3

int __thiscall MkvInterface::close(MkvInterface *this,int __fd)

{
  KaxSegment *this_00;
  KaxCues *this_01;
  uint64 uVar1;
  bool bVar2;
  int extraout_EAX;
  int iVar3;
  int iVar4;
  int iVar5;
  EbmlMaster *this_02;
  EbmlElement *pEVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  filepos_t fVar7;
  StdIOCallback *output;
  
  flushCluster(this);
  output = this->m_file;
  iVar3 = extraout_EAX;
  if (output != (StdIOCallback *)0x0) {
    if (this->m_writeMode == true) {
      this_01 = this->m_cues;
      if ((this_01 != (KaxCues *)0x0) &&
         ((this_01->super_EbmlMaster).ElementList.
          super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this_01->super_EbmlMaster).ElementList.
          super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
          _M_impl.super__Vector_impl_data._M_start)) {
        bVar2 = this->m_writeDefaultValues;
        libebml::EbmlMaster::Sort(&this_01->super_EbmlMaster);
        libebml::EbmlElement::Render
                  ((EbmlElement *)this_01,&output->super_IOCallback,bVar2,false,false);
        libmatroska::KaxSeekHead::IndexThis
                  (this->m_metaSeek,(EbmlElement *)this->m_cues,&this->m_fileSegment);
      }
      this_00 = &this->m_fileSegment;
      this_02 = (EbmlMaster *)
                libebml::EbmlMaster::FindFirstElt
                          (&this_00->super_EbmlMaster,
                           (EbmlCallbacks *)libmatroska::KaxInfo::ClassInfos,true);
      pEVar6 = libebml::EbmlMaster::FindFirstElt
                         (this_02,(EbmlCallbacks *)libmatroska::KaxDuration::ClassInfos,true);
      pEVar6[1]._vptr_EbmlElement =
           (_func_int **)(double)((float)this->m_frameCount * this->m_frameDuration);
      pEVar6->bValueIsSet = true;
      (*(this_02->super_EbmlElement)._vptr_EbmlElement[8])(this_02,0,0);
      iVar3 = (*(this->m_file->super_IOCallback)._vptr_IOCallback[5])();
      (*(this->m_file->super_IOCallback)._vptr_IOCallback[3])
                (this->m_file,(this_02->super_EbmlElement).ElementPosition,0);
      libebml::EbmlElement::Render
                ((EbmlElement *)this_02,&this->m_file->super_IOCallback,false,false,false);
      (*(this->m_file->super_IOCallback)._vptr_IOCallback[3])
                (this->m_file,CONCAT44(extraout_var_00,iVar3),0);
      libebml::EbmlVoid::ReplaceWith
                (this->m_dummy,(EbmlElement *)this->m_metaSeek,&this->m_file->super_IOCallback,true,
                 false);
      (*(this->m_file->super_IOCallback)._vptr_IOCallback[3])(this->m_file,0,2);
      iVar4 = (*(this->m_file->super_IOCallback)._vptr_IOCallback[5])();
      uVar1 = (this->m_fileSegment).super_EbmlMaster.super_EbmlElement.ElementPosition;
      iVar3 = (*(this->m_fileSegment).super_EbmlMaster.super_EbmlElement._vptr_EbmlElement[3])
                        (this_00);
      iVar3 = *(int *)(CONCAT44(extraout_var_02,iVar3) + 8);
      iVar5 = libebml::CodedSizeLength
                        ((this->m_fileSegment).super_EbmlMaster.super_EbmlElement.Size,
                         (this->m_fileSegment).super_EbmlMaster.super_EbmlElement.SizeLength,
                         (this->m_fileSegment).super_EbmlMaster.super_EbmlElement.bSizeIsFinite);
      bVar2 = libebml::EbmlElement::ForceSize
                        ((EbmlElement *)this_00,
                         CONCAT44(extraout_var_01,iVar4) - ((iVar5 + iVar3 & 0xff) + uVar1));
      iVar3 = (int)CONCAT71(extraout_var,bVar2);
      if (bVar2) {
        fVar7 = libebml::EbmlElement::OverwriteHead
                          ((EbmlElement *)this_00,&this->m_file->super_IOCallback,false);
        iVar3 = (int)fVar7;
      }
      output = this->m_file;
      if (output == (StdIOCallback *)0x0) goto LAB_0017f592;
    }
    iVar3 = (*(output->super_IOCallback)._vptr_IOCallback[6])(output);
    if (this->m_file != (StdIOCallback *)0x0) {
      iVar3 = (*(this->m_file->super_IOCallback)._vptr_IOCallback[1])();
    }
  }
LAB_0017f592:
  this->m_file = (StdIOCallback *)0x0;
  return iVar3;
}

Assistant:

void MkvInterface::close()
{
    flushCluster();
    
    if (m_file != NULL && m_writeMode)
    {
        if (m_cues != NULL && m_cues->ListSize() > 0)
        {
            m_cues->Render(*m_file, m_writeDefaultValues);
            m_metaSeek->IndexThis(*m_cues, m_fileSegment);
        }
        
        KaxInfo & MyInfos = GetChild<KaxInfo>(m_fileSegment);

        KaxDuration &Duration = GetChild<KaxDuration>(MyInfos);
        *(static_cast<EbmlFloat *>(&Duration)) = m_frameDuration * m_frameCount;

        MyInfos.UpdateSize();

        uint64 origPos = m_file->getFilePointer();
        m_file->setFilePointer(MyInfos.GetElementPosition());
        MyInfos.Render(*m_file);
        m_file->setFilePointer(origPos);
        
        // write the seek head
        m_dummy->ReplaceWith(*m_metaSeek, *m_file);
        
        m_file->setFilePointer(0, seek_end);
	    if (m_fileSegment.ForceSize(m_file->getFilePointer() -
                                    m_fileSegment.GetElementPosition() -
                                    m_fileSegment.HeadSize()))
            m_fileSegment.OverwriteHead(*m_file);
    }
    
    if (m_file != NULL)
    {
        m_file->close();
        delete m_file;
    }
    m_file = NULL;
}